

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O0

void __thiscall CDBWrapper::~CDBWrapper(CDBWrapper *this)

{
  long lVar1;
  FilterPolicy *pFVar2;
  Logger *pLVar3;
  Cache *pCVar4;
  LevelDBContext *pLVar5;
  long in_FS_OFFSET;
  CDBWrapper *in_stack_ffffffffffffff68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pLVar5 = DBContext(in_stack_ffffffffffffff68);
  if (pLVar5->pdb != (DB *)0x0) {
    (*pLVar5->pdb->_vptr_DB[1])();
  }
  pLVar5 = DBContext(in_stack_ffffffffffffff68);
  pLVar5->pdb = (DB *)0x0;
  pLVar5 = DBContext(in_stack_ffffffffffffff68);
  pFVar2 = (pLVar5->options).filter_policy;
  if (pFVar2 != (FilterPolicy *)0x0) {
    (*pFVar2->_vptr_FilterPolicy[1])();
  }
  pLVar5 = DBContext(in_stack_ffffffffffffff68);
  (pLVar5->options).filter_policy = (FilterPolicy *)0x0;
  pLVar5 = DBContext(in_stack_ffffffffffffff68);
  pLVar3 = (pLVar5->options).info_log;
  if (pLVar3 != (Logger *)0x0) {
    (*pLVar3->_vptr_Logger[1])();
  }
  pLVar5 = DBContext(in_stack_ffffffffffffff68);
  (pLVar5->options).info_log = (Logger *)0x0;
  pLVar5 = DBContext(in_stack_ffffffffffffff68);
  pCVar4 = (pLVar5->options).block_cache;
  if (pCVar4 != (Cache *)0x0) {
    (*pCVar4->_vptr_Cache[1])();
  }
  pLVar5 = DBContext(in_stack_ffffffffffffff68);
  (pLVar5->options).block_cache = (Cache *)0x0;
  pLVar5 = DBContext(in_stack_ffffffffffffff68);
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)pLVar5->penv;
  if (this_00 != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    (**(_func_int **)
       ((long)(this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start + 8))();
  }
  pLVar5 = DBContext(in_stack_ffffffffffffff68);
  (pLVar5->options).env = (Env *)0x0;
  fs::path::~path((path *)in_stack_ffffffffffffff68);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff68);
  std::unique_ptr<LevelDBContext,_std::default_delete<LevelDBContext>_>::~unique_ptr
            ((unique_ptr<LevelDBContext,_std::default_delete<LevelDBContext>_> *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CDBWrapper::~CDBWrapper()
{
    delete DBContext().pdb;
    DBContext().pdb = nullptr;
    delete DBContext().options.filter_policy;
    DBContext().options.filter_policy = nullptr;
    delete DBContext().options.info_log;
    DBContext().options.info_log = nullptr;
    delete DBContext().options.block_cache;
    DBContext().options.block_cache = nullptr;
    delete DBContext().penv;
    DBContext().options.env = nullptr;
}